

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall
FIX::DataDictionary::MessageFieldsOrderHolder::~MessageFieldsOrderHolder
          (MessageFieldsOrderHolder *this)

{
  MessageFieldsOrderHolder *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_orderedFlds);
  message_order::~message_order(&this->m_msgOrder);
  return;
}

Assistant:

~MessageFieldsOrderHolder() {}